

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<CollectLHSSymbols,_true,_true,_false,_false>::
visit<slang::ast::TypeAliasType>
          (ASTVisitor<CollectLHSSymbols,_true,_true,_false,_false> *this,TypeAliasType *t)

{
  TypeAliasType *in_RDI;
  ASTVisitor<CollectLHSSymbols,_true,_true,_false,_false> *unaff_retaddr;
  
  visitDefault<slang::ast::TypeAliasType>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }